

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

int wabt::OptionParser::Match(char *s,string *full,bool has_argument)

{
  char cVar1;
  char *pcVar2;
  int local_28;
  int i;
  bool has_argument_local;
  string *full_local;
  char *s_local;
  
  local_28 = 0;
  while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)full), *pcVar2 != '\0') {
    if (s[local_28] == '\0') goto LAB_00150226;
    cVar1 = s[local_28];
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)full);
    if (cVar1 != *pcVar2) {
      return -1;
    }
    local_28 = local_28 + 1;
  }
  if (s[local_28] == '\0') {
    s_local._4_4_ = local_28 + 1;
  }
  else if ((has_argument) && (s[local_28] == '=')) {
LAB_00150226:
    s_local._4_4_ = local_28;
  }
  else {
    s_local._4_4_ = -1;
  }
  return s_local._4_4_;
}

Assistant:

int OptionParser::Match(const char* s,
                        const std::string& full,
                        bool has_argument) {
  int i;
  for (i = 0;; i++) {
    if (full[i] == '\0') {
      // Perfect match. Return +1, so it will be preferred over a longer option
      // with the same prefix.
      if (s[i] == '\0') {
        return i + 1;
      }

      // We want to fail if s is longer than full, e.g. --foobar vs. --foo.
      // However, if s ends with an '=', it's OK.
      if (!(has_argument && s[i] == '=')) {
        return -1;
      }
      break;
    }
    if (s[i] == '\0') {
      break;
    }
    if (s[i] != full[i]) {
      return -1;
    }
  }
  return i;
}